

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_contextual_begin(nk_context *ctx,nk_flags flags,nk_vec2 size,nk_rect trigger_bounds)

{
  float fVar1;
  uint uVar2;
  nk_window *pnVar3;
  nk_window *pnVar4;
  nk_rect *pnVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  nk_rect body;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x421c,
                  "int nk_contextual_begin(struct nk_context *, nk_flags, struct nk_vec2, struct nk_rect)"
                 );
  }
  pnVar3 = ctx->current;
  if (pnVar3 != (nk_window *)0x0) {
    if (pnVar3->layout != (nk_panel *)0x0) {
      uVar8 = (pnVar3->popup).con_count + 1;
      (pnVar3->popup).con_count = uVar8;
      iVar7 = 0;
      if (pnVar3 == ctx->active) {
        pnVar4 = (pnVar3->popup).win;
        iVar7 = 0;
        if (pnVar4 == (nk_window *)0x0) {
          bVar9 = false;
        }
        else {
          bVar9 = (pnVar3->popup).type == NK_PANEL_CONTEXTUAL;
        }
        iVar6 = nk_input_mouse_clicked(&ctx->input,NK_BUTTON_RIGHT,trigger_bounds);
        uVar2 = (pnVar3->popup).active_con;
        if (uVar8 == uVar2 || uVar2 == 0) {
          if (uVar2 != 0 && !bVar9) {
            (pnVar3->popup).active_con = 0;
          }
          if ((bool)(bVar9 | iVar6 != 0)) {
            (pnVar3->popup).active_con = uVar8;
            if (iVar6 == 0) {
              fVar1 = (pnVar4->bounds).x;
              pnVar5 = &pnVar4->bounds;
            }
            else {
              fVar1 = (ctx->input).mouse.pos.x;
              pnVar5 = (nk_rect *)&(ctx->input).mouse.pos;
            }
            body.y = pnVar5->y;
            body.x = fVar1;
            body._8_8_ = size;
            iVar7 = nk_nonblock_begin(ctx,flags | 0x20,body,(nk_rect)ZEXT816(0xbf800000bf800000),
                                      NK_PANEL_CONTEXTUAL);
            if (iVar7 == 0) {
              (pnVar3->popup).active_con = 0;
              (pnVar3->popup).type = NK_PANEL_NONE;
              pnVar3 = (pnVar3->popup).win;
              if (pnVar3 != (nk_window *)0x0) {
                pnVar3->flags = 0;
              }
            }
            else {
              (pnVar3->popup).type = NK_PANEL_CONTEXTUAL;
            }
          }
        }
      }
      return iVar7;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x421e,
                  "int nk_contextual_begin(struct nk_context *, nk_flags, struct nk_vec2, struct nk_rect)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x421d,
                "int nk_contextual_begin(struct nk_context *, nk_flags, struct nk_vec2, struct nk_rect)"
               );
}

Assistant:

NK_API int
nk_contextual_begin(struct nk_context *ctx, nk_flags flags, struct nk_vec2 size,
    struct nk_rect trigger_bounds)
{
    struct nk_window *win;
    struct nk_window *popup;
    struct nk_rect body;

    NK_STORAGE const struct nk_rect null_rect = {-1,-1,0,0};
    int is_clicked = 0;
    int is_open = 0;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    ++win->popup.con_count;
    if (ctx->current != ctx->active)
        return 0;

    /* check if currently active contextual is active */
    popup = win->popup.win;
    is_open = (popup && win->popup.type == NK_PANEL_CONTEXTUAL);
    is_clicked = nk_input_mouse_clicked(&ctx->input, NK_BUTTON_RIGHT, trigger_bounds);
    if (win->popup.active_con && win->popup.con_count != win->popup.active_con)
        return 0;
    if (!is_open && win->popup.active_con)
        win->popup.active_con = 0;
    if ((!is_open && !is_clicked))
        return 0;

    /* calculate contextual position on click */
    win->popup.active_con = win->popup.con_count;
    if (is_clicked) {
        body.x = ctx->input.mouse.pos.x;
        body.y = ctx->input.mouse.pos.y;
    } else {
        body.x = popup->bounds.x;
        body.y = popup->bounds.y;
    }
    body.w = size.x;
    body.h = size.y;

    /* start nonblocking contextual popup */
    ret = nk_nonblock_begin(ctx, flags|NK_WINDOW_NO_SCROLLBAR, body,
            null_rect, NK_PANEL_CONTEXTUAL);
    if (ret) win->popup.type = NK_PANEL_CONTEXTUAL;
    else {
        win->popup.active_con = 0;
        win->popup.type = NK_PANEL_NONE;
        if (win->popup.win)
            win->popup.win->flags = 0;
    }
    return ret;
}